

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O3

bool benchmarkMany8(string *fn_name,uint32_t n,uint32_t m,uint32_t iterations,
                   pospopcnt_u8_method_type fn,bool verbose,bool test,bool tabular)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint8_t *puVar4;
  pointer puVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  byte bVar12;
  byte bVar13;
  string *psVar14;
  uint uVar15;
  result_type rVar16;
  int iVar17;
  pointer pvVar18;
  undefined8 uVar19;
  long lVar20;
  pointer pvVar21;
  double dVar22;
  char *__format;
  undefined7 in_register_00000089;
  undefined4 uVar23;
  ulong uVar24;
  bool bVar25;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *x;
  ulong uVar26;
  long lVar27;
  ushort uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  pospopcnt_u8_method_type p_Var37;
  undefined1 auVar38 [64];
  undefined8 in_XMM7_Qa;
  undefined8 in_XMM7_Qb;
  vector<double,_std::allocator<double>_> avg;
  vector<unsigned_int,_std::allocator<unsigned_int>_> times;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vdata;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> mins;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  allresults;
  uniform_int_distribution<int> dis;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> results;
  LinuxEvents<0> unified;
  random_device rd;
  mt19937 gen;
  vector<int,_std::allocator<int>_> local_2978;
  double local_2960;
  allocator_type local_2951;
  double local_2950;
  undefined1 local_2948 [16];
  pointer local_2938;
  pospopcnt_u8_method_type local_2930;
  uint32_t local_2928;
  uint local_2924;
  double local_2920;
  undefined1 local_2918 [16];
  uint *local_2908;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_28f8;
  undefined4 local_28dc;
  value_type local_28d8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_28c0;
  undefined1 local_28a8 [16];
  pointer local_2898;
  string *local_2888;
  undefined8 local_2880;
  ulong local_2878;
  param_type local_2870;
  undefined1 local_2868 [16];
  pointer local_2858;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2848;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2830;
  vector<int,_std::allocator<int>_> local_2818;
  LinuxEvents<0> local_2800;
  anon_union_5000_2_650ea050_for_random_device_0 local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_2930 = fn;
  local_2928 = n;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2740.field_0,(ulong)n,
             (allocator_type *)&local_13b8);
  local_2950 = (double)(ulong)m;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(&local_28f8,(size_type)local_2950,(value_type *)&local_2740.field_0,
           (allocator_type *)&local_2800);
  if ((void *)CONCAT44(local_2740._M_mt._M_x[0]._4_4_,local_2740._M_mt._M_x[0]._0_4_) != (void *)0x0
     ) {
    operator_delete((void *)CONCAT44(local_2740._M_mt._M_x[0]._4_4_,local_2740._M_mt._M_x[0]._0_4_))
    ;
  }
  uVar23 = (undefined4)CONCAT71(in_register_00000089,verbose);
  local_2960 = (double)CONCAT44(local_2960._4_4_,m);
  if (verbose && !tabular) {
    printf("alignments: ");
    pvVar21 = local_28f8.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar18 = local_28f8.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pvVar18 != pvVar21;
        pvVar18 = pvVar18 + 1) {
      printf("%d ",(ulong)(-*(int *)&(pvVar18->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_start &
                          *(uint *)&(pvVar18->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_start));
    }
    putchar(10);
  }
  local_2740._M_mt._M_x[0]._0_4_ = 0;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 1;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 5;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 5;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 2;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 3;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 9;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 9;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_2818,&local_2978);
  LinuxEvents<0>::LinuxEvents(&local_2800,&local_2818);
  if (local_2818.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2818.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_2898 = (pointer)0x0;
  local_2908 = (uint *)0x0;
  local_2868 = (undefined1  [16])0x0;
  local_2858 = (pointer)0x0;
  local_28a8 = (undefined1  [16])0x0;
  local_2918 = (undefined1  [16])0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_2868,
             (long)local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  std::random_device::random_device((random_device *)&local_2740.field_0);
  uVar15 = std::random_device::_M_getval();
  local_13b8._M_x[0] = (unsigned_long)uVar15;
  local_2920 = (double)CONCAT71(local_2920._1_7_,test);
  lVar20 = 1;
  uVar26 = local_13b8._M_x[0];
  do {
    uVar26 = (ulong)(((uint)(uVar26 >> 0x1e) ^ (uint)uVar26) * 0x6c078965 + (int)lVar20);
    local_13b8._M_x[lVar20] = uVar26;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x270);
  local_13b8._M_p = 0x270;
  local_2870._M_a = 0;
  local_2870._M_b = 0xff;
  local_2924 = iterations;
  local_28dc = uVar23;
  local_2888 = fn_name;
  if (iterations == 0) {
    bVar25 = true;
  }
  else {
    local_2920 = (double)((ulong)local_2920 ^ 1);
    bVar25 = true;
    lVar20 = (long)local_2950 * 0x18;
    uVar26 = 0;
    do {
      local_2878 = uVar26;
      if (local_28f8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_28f8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar26 = 0;
        pvVar18 = local_28f8.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar21 = local_28f8.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        do {
          if (pvVar18[uVar26].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              pvVar18[uVar26].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            uVar24 = 0;
            do {
              rVar16 = std::uniform_int_distribution<int>::operator()
                                 ((uniform_int_distribution<int> *)&local_2870,&local_13b8,
                                  &local_2870);
              local_28f8.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar26].
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar24] = (uchar)rVar16;
              uVar24 = uVar24 + 1;
              pvVar18 = local_28f8.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pvVar21 = local_28f8.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            } while (uVar24 < (ulong)((long)local_28f8.
                                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar26].
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_28f8.
                                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar26].
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start));
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 < (ulong)(((long)pvVar21 - (long)pvVar18 >> 3) * -0x5555555555555555));
      }
      local_2938 = (pointer)0x0;
      local_2948 = (undefined1  [16])0x0;
      local_2948._0_8_ = operator_new(0x20);
      local_2938 = (pointer)(local_2948._0_8_ + 0x20);
      *(undefined8 *)local_2948._0_8_ = 0;
      *(undefined8 *)(local_2948._0_8_ + 8) = 0;
      *(undefined8 *)(local_2948._0_8_ + 0x10) = 0;
      *(undefined8 *)(local_2948._0_8_ + 0x18) = 0;
      local_2948._8_8_ = local_2938;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(&local_28c0,(size_type)local_2950,(value_type *)local_2948,
               (allocator_type *)&local_28d8);
      if ((pointer)local_2948._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2948._0_8_);
      }
      if (local_2960._0_4_ != 0) {
        lVar27 = 0;
        do {
          puVar4 = *(uint8_t **)
                    ((long)&((local_28f8.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar27);
          pospopcnt_u8_scalar_naive
                    (puVar4,*(long *)((long)&((local_28f8.
                                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             )._M_impl.super__Vector_impl_data._M_finish + lVar27) -
                            (long)puVar4,
                     *(uint32_t **)
                      ((long)&((local_28c0.
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar27));
          lVar27 = lVar27 + 0x18;
        } while (lVar20 != lVar27);
      }
      local_28d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_28d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_28d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_28d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
      local_28d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)local_28d8.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + 0x20);
      *(undefined8 *)
       local_28d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = 0;
      *(undefined8 *)
       ((long)local_28d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start + 8) = 0;
      *(undefined8 *)
       ((long)local_28d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start + 0x10) = 0;
      *(undefined8 *)
       ((long)local_28d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start + 0x18) = 0;
      local_28d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_28d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)local_2948,(size_type)local_2950,&local_28d8,&local_2951);
      if (local_28d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_28d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      iVar17 = std::chrono::_V2::system_clock::now();
      LinuxEvents<0>::start(&local_2800);
      if (local_2960._0_4_ != 0) {
        lVar27 = 0;
        do {
          puVar4 = *(uint8_t **)
                    ((long)&((local_28f8.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar27);
          (*local_2930)(puVar4,*(long *)((long)&((local_28f8.
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                )._M_impl.super__Vector_impl_data._M_finish + lVar27
                                        ) - (long)puVar4,
                        *(uint32_t **)
                         ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  local_2948._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                         lVar27));
          lVar27 = lVar27 + 0x18;
        } while (lVar20 != lVar27);
      }
      LinuxEvents<0>::end(&local_2800,
                          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                          local_2868);
      uVar19 = std::chrono::_V2::system_clock::now();
      if (local_2960._0_4_ == 0) {
LAB_0011a0e7:
        bVar6 = false;
      }
      else {
        lVar27 = 0;
        uVar26 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                            local_2948._0_8_)->_M_impl).super__Vector_impl_data._M_start + lVar27);
          lVar27 = lVar27 + 0x18;
          auVar32 = vpmovzxdq_avx512f(*(undefined1 (*) [32])*puVar1);
          auVar32 = vpaddq_avx512f(ZEXT864(uVar26),auVar32);
          auVar31 = vextracti64x4_avx512f(auVar32,1);
          auVar32 = vpaddq_avx512f(auVar32,ZEXT3264(auVar31));
          auVar7 = vpaddq_avx(auVar32._0_16_,auVar32._16_16_);
          auVar29 = vpshufd_avx(auVar7,0xee);
          auVar7 = vpaddq_avx(auVar7,auVar29);
          uVar26 = auVar7._0_8_;
        } while (lVar20 != lVar27);
        if (uVar26 == 0) goto LAB_0011a0e7;
        local_2880 = uVar19;
        if (local_2960._0_4_ != 0) {
          dVar22 = 0.0;
          do {
            lVar27 = 0;
            do {
              uVar15 = local_28c0.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)dVar22].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar27];
              uVar3 = (((pointer)(local_2948._0_8_ + dVar22 * 0x18))->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar27];
              if (uVar15 != uVar3 && local_2920._0_1_ == '\0') {
                puts("bug:");
                bVar6 = false;
                printf("expected : ");
                print16(local_28c0.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)dVar22].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
                printf("got      : ");
                print16((((pointer)(local_2948._0_8_ + dVar22 * 0x18))->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start);
                goto LAB_0011a150;
              }
              lVar27 = lVar27 + 1;
              bVar25 = (bool)(bVar25 & uVar15 == uVar3);
            } while (lVar27 != 8);
            dVar22 = (double)((long)dVar22 + 1);
          } while (dVar22 != local_2950);
        }
        std::
        vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
        ::push_back((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                     *)local_28a8,(value_type *)local_2868);
        uVar15 = (int)local_2880 - iVar17;
        local_28d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = uVar15;
        if ((uint *)local_2918._8_8_ == local_2908) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2918,
                     (iterator)local_2918._8_8_,(uint *)&local_28d8);
        }
        else {
          *(uint *)local_2918._8_8_ = uVar15;
          local_2918._8_8_ = (uint *)(local_2918._8_8_ + 4);
        }
        bVar6 = true;
      }
LAB_0011a150:
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)local_2948);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_28c0);
      if (!bVar6) {
        bVar25 = false;
        goto LAB_0011a52e;
      }
      uVar15 = (int)local_2878 + 1;
      uVar26 = (ulong)uVar15;
    } while (uVar15 != local_2924);
  }
  if (local_2918._0_8_ == local_2918._8_8_) {
    uVar26 = 0;
  }
  else {
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar38 = ZEXT1664((undefined1  [16])0x0);
    uVar24 = 0;
    auVar34 = vpbroadcastq_avx512f();
    auVar34 = vpsrlq_avx512f(auVar34,2);
    uVar26 = ((ulong)(local_2918._8_8_ + (-4 - local_2918._0_8_)) >> 2) + 0x10 & 0xfffffffffffffff0;
    do {
      auVar35 = vpbroadcastq_avx512f();
      auVar36 = vmovdqa64_avx512f(auVar38);
      auVar38 = vporq_avx512f(auVar35,auVar32);
      auVar35 = vporq_avx512f(auVar35,auVar33);
      uVar19 = vpcmpuq_avx512f(auVar35,auVar34,2);
      bVar12 = (byte)uVar19;
      uVar19 = vpcmpuq_avx512f(auVar38,auVar34,2);
      bVar13 = (byte)uVar19;
      uVar28 = CONCAT11(bVar13,bVar12);
      auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_2918._0_8_ + uVar24 * 4));
      auVar35._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar38._4_4_;
      auVar35._0_4_ = (uint)(bVar12 & 1) * auVar38._0_4_;
      auVar35._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar38._8_4_;
      auVar35._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar38._12_4_;
      auVar35._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar38._16_4_;
      auVar35._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar38._20_4_;
      auVar35._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar38._24_4_;
      auVar35._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar38._28_4_;
      auVar35._32_4_ = (uint)(bVar13 & 1) * auVar38._32_4_;
      auVar35._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar38._36_4_;
      auVar35._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar38._40_4_;
      auVar35._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar38._44_4_;
      auVar35._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar38._48_4_;
      auVar35._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar38._52_4_;
      auVar35._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar38._56_4_;
      auVar35._60_4_ = (uint)(bVar13 >> 7) * auVar38._60_4_;
      uVar24 = uVar24 + 0x10;
      auVar38 = vpaddd_avx512f(auVar35,auVar36);
    } while (uVar26 != uVar24);
    auVar32 = vmovdqa32_avx512f(auVar38);
    auVar33._0_4_ = (uint)(bVar12 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar36._0_4_;
    bVar6 = (bool)((byte)(uVar28 >> 1) & 1);
    auVar33._4_4_ = (uint)bVar6 * auVar32._4_4_ | (uint)!bVar6 * auVar36._4_4_;
    bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
    auVar33._8_4_ = (uint)bVar6 * auVar32._8_4_ | (uint)!bVar6 * auVar36._8_4_;
    bVar6 = (bool)((byte)(uVar28 >> 3) & 1);
    auVar33._12_4_ = (uint)bVar6 * auVar32._12_4_ | (uint)!bVar6 * auVar36._12_4_;
    bVar6 = (bool)((byte)(uVar28 >> 4) & 1);
    auVar33._16_4_ = (uint)bVar6 * auVar32._16_4_ | (uint)!bVar6 * auVar36._16_4_;
    bVar6 = (bool)((byte)(uVar28 >> 5) & 1);
    auVar33._20_4_ = (uint)bVar6 * auVar32._20_4_ | (uint)!bVar6 * auVar36._20_4_;
    bVar6 = (bool)((byte)(uVar28 >> 6) & 1);
    auVar33._24_4_ = (uint)bVar6 * auVar32._24_4_ | (uint)!bVar6 * auVar36._24_4_;
    bVar6 = (bool)((byte)(uVar28 >> 7) & 1);
    auVar33._28_4_ = (uint)bVar6 * auVar32._28_4_ | (uint)!bVar6 * auVar36._28_4_;
    auVar33._32_4_ =
         (uint)(bVar13 & 1) * auVar32._32_4_ | (uint)!(bool)(bVar13 & 1) * auVar36._32_4_;
    bVar6 = (bool)(bVar13 >> 1 & 1);
    auVar33._36_4_ = (uint)bVar6 * auVar32._36_4_ | (uint)!bVar6 * auVar36._36_4_;
    bVar6 = (bool)(bVar13 >> 2 & 1);
    auVar33._40_4_ = (uint)bVar6 * auVar32._40_4_ | (uint)!bVar6 * auVar36._40_4_;
    bVar6 = (bool)(bVar13 >> 3 & 1);
    auVar33._44_4_ = (uint)bVar6 * auVar32._44_4_ | (uint)!bVar6 * auVar36._44_4_;
    bVar6 = (bool)(bVar13 >> 4 & 1);
    auVar33._48_4_ = (uint)bVar6 * auVar32._48_4_ | (uint)!bVar6 * auVar36._48_4_;
    bVar6 = (bool)(bVar13 >> 5 & 1);
    auVar33._52_4_ = (uint)bVar6 * auVar32._52_4_ | (uint)!bVar6 * auVar36._52_4_;
    bVar6 = (bool)(bVar13 >> 6 & 1);
    auVar33._56_4_ = (uint)bVar6 * auVar32._56_4_ | (uint)!bVar6 * auVar36._56_4_;
    auVar33._60_4_ =
         (uint)(bVar13 >> 7) * auVar32._60_4_ | (uint)!(bool)(bVar13 >> 7) * auVar36._60_4_;
    auVar31 = vextracti64x4_avx512f(auVar33,1);
    auVar32 = vpaddd_avx512f(auVar33,ZEXT3264(auVar31));
    auVar7 = vpaddd_avx(auVar32._0_16_,auVar32._16_16_);
    auVar29 = vpshufd_avx(auVar7,0xee);
    auVar7 = vpaddd_avx(auVar7,auVar29);
    auVar29 = vpshufd_avx(auVar7,0x55);
    auVar7 = vpaddd_avx(auVar7,auVar29);
    uVar26 = CONCAT44((int)(uVar26 >> 0x20),auVar7._0_4_);
  }
  lVar20 = local_2918._8_8_ - local_2918._0_8_;
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector(&local_2830,
           (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)local_28a8);
  compute_mins((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)&local_28c0,
               &local_2830);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector(&local_2830);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector(&local_2848,
           (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)local_28a8);
  compute_averages((vector<double,_std::allocator<double>_> *)local_2948,&local_2848);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector(&local_2848);
  psVar14 = local_2888;
  auVar7._8_8_ = in_XMM7_Qb;
  auVar7._0_8_ = in_XMM7_Qa;
  auVar7 = vcvtusi2sd_avx512f(auVar7,local_2928);
  dVar22 = auVar7._0_8_ * 9.5367431640625e-07;
  if (tabular) {
    if (local_2924 != 0) {
      uVar26 = (ulong)local_2924;
      uVar24 = 0;
      auVar8._8_8_ = in_XMM7_Qb;
      auVar8._0_8_ = in_XMM7_Qa;
      auVar7 = vcvtusi2sd_avx512f(auVar8,local_2960._0_4_ * local_2928);
      local_2960 = auVar7._0_8_;
      local_2920 = dVar22;
      do {
        auVar9._8_8_ = in_XMM7_Qb;
        auVar9._0_8_ = in_XMM7_Qa;
        auVar7 = vcvtusi2sd_avx512f(auVar9,*(pointer)(local_2918._0_8_ + uVar24 * 4));
        local_2930 = (pospopcnt_u8_method_type)(local_2920 / (auVar7._0_8_ / 1000000000.0));
        printf("%s\t%u\t%d\t",(psVar14->_M_dataplus)._M_p,(ulong)local_2928,uVar24 & 0xffffffff);
        auVar29 = vcvtuqq2pd_avx512vl(*(undefined1 (*) [16])
                                       (((pointer)(local_28a8._0_8_ + uVar24 * 0x18))->
                                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                       )._M_impl.super__Vector_impl_data._M_start);
        auVar7 = vshufpd_avx(auVar29,auVar29,1);
        printf("%4.2f\t%4.3f\t%4.3f\t",auVar7._0_8_ / auVar29._0_8_,auVar29._0_8_ / local_2960,
               auVar7._0_8_ / local_2960);
        puVar5 = (((pointer)(local_28a8._0_8_ + uVar24 * 0x18))->
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        printf("%llu\t%llu\t%llu\t%llu\t%llu\t",*puVar5,puVar5[1],puVar5[2],puVar5[3],puVar5[4]);
        printf("%u\t%4.2f\n",local_2930,(ulong)*(uint *)(local_2918._0_8_ + uVar24 * 4));
        uVar24 = uVar24 + 1;
      } while (uVar24 != uVar26);
    }
  }
  else {
    if ((char)local_28dc == '\0') {
      auVar29._8_8_ = in_XMM7_Qb;
      auVar29._0_8_ = in_XMM7_Qa;
      auVar29 = vcvtusi2sd_avx512f(auVar29,((local_28c0.
                                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_start);
      __format = "cycles per 8-bit word:  %4.3f; ref cycles per 8-bit word: %4.3f \n";
      auVar30._8_8_ = in_XMM7_Qb;
      auVar30._0_8_ = in_XMM7_Qa;
      auVar7 = vcvtusi2sd_avx512f(auVar30,local_2960._0_4_ * local_2928);
      dVar22 = auVar29._0_8_ / auVar7._0_8_;
      auVar11._8_8_ = in_XMM7_Qb;
      auVar11._0_8_ = in_XMM7_Qa;
      auVar29 = vcvtusi2sd_avx512f(auVar11,local_28c0.
                                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1].
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      p_Var37 = (pospopcnt_u8_method_type)(auVar29._0_8_ / auVar7._0_8_);
    }
    else {
      local_2950 = (double)(uVar26 / (ulong)(lVar20 >> 2));
      local_2930 = (pospopcnt_u8_method_type)(dVar22 / (local_2950 / 1000000000.0));
      auVar2._0_8_ = ((local_28c0.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
      auVar2._8_8_ = ((local_28c0.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
      auVar30 = vcvtuqq2pd_avx512vl(auVar2);
      auVar7 = vshufpd_avx(auVar30,auVar30,1);
      auVar10._8_8_ = in_XMM7_Qb;
      auVar10._0_8_ = in_XMM7_Qa;
      auVar29 = vcvtusi2sd_avx512f(auVar10,local_2960._0_4_ * local_2928);
      printf("instructions per cycle %4.2f, cycles per 8-bit word:  %4.3f, instructions per 8-bit word %4.3f \n"
             ,auVar7._0_8_ / auVar30._0_8_,auVar30._0_8_ / auVar29._0_8_,
             auVar7._0_8_ / auVar29._0_8_);
      printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu cache ref., %8llu cache mis.\n"
             ,((local_28c0.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start,
             ((local_28c0.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             ((local_28c0.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             local_28c0.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_28c0.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish);
      printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f cache ref., %8.1f cache mis.\n"
             ,(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2948._0_8_)->
              _M_impl).super__Vector_impl_data._M_start,
             (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2948._0_8_)->
             _M_impl).super__Vector_impl_data._M_finish,
             (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2948._0_8_)->
             _M_impl).super__Vector_impl_data._M_end_of_storage,
             (((pointer)(local_2948._0_8_ + 0x18))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (((pointer)(local_2948._0_8_ + 0x18))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
      __format = "avg time: %f ns, %4.2f mb/s\n";
      dVar22 = local_2950;
      p_Var37 = local_2930;
    }
    printf(__format,dVar22,p_Var37);
  }
  if ((pointer)local_2948._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2948._0_8_);
  }
  if (local_28c0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28c0.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0011a52e:
  std::random_device::_M_fini();
  if ((pointer)local_2918._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2918._0_8_);
  }
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)local_28a8);
  if ((pointer)local_2868._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2868._0_8_);
  }
  LinuxEvents<0>::~LinuxEvents(&local_2800);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_28f8);
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar25;
}

Assistant:

bool benchmarkMany8(const std::string& fn_name, uint32_t n, uint32_t m, uint32_t iterations, pospopcnt_u8_method_type fn, bool verbose, bool test, bool tabular) {
    std::vector<int> evts;
#ifdef ALIGN
    std::vector<std::vector<uint8_t,AlignedSTLAllocator<uint8_t,64>>> vdata(m, std::vector<uint8_t,AlignedSTLAllocator<uint8_t,64>>(n));
#else
    std::vector<std::vector<uint8_t>> vdata(m, std::vector<uint8_t>(n));
#endif
#ifdef ALIGN
    for(auto & x : vdata) {
      assert(get_alignment(x.data()) == 64);
    }
#endif
    if(verbose && !tabular) {
      printf("alignments: ");
      for(auto & x : vdata) {
        printf("%d ", get_alignment(x.data()));
      }
      printf("\n");
    }    
    evts.push_back(PERF_COUNT_HW_CPU_CYCLES);
    evts.push_back(PERF_COUNT_HW_INSTRUCTIONS);
    evts.push_back(PERF_COUNT_HW_BRANCH_MISSES);
    evts.push_back(PERF_COUNT_HW_CACHE_REFERENCES);
    evts.push_back(PERF_COUNT_HW_CACHE_MISSES);
    evts.push_back(PERF_COUNT_HW_REF_CPU_CYCLES);
    LinuxEvents<PERF_TYPE_HARDWARE> unified(evts);
    std::vector<unsigned long long> results; // tmp buffer
    std::vector< std::vector<unsigned long long> > allresults;
    std::vector<uint32_t> times;
    results.resize(evts.size());
    
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, 0xFF);

    bool isok = true;
    for (uint32_t i = 0; i < iterations; i++) {
        for (size_t k = 0; k < vdata.size(); k++) {
            for(size_t k2 = 0; k2 < vdata[k].size() ; k2++) { 
               vdata[k][k2] = dis(gen); // random init.
            }
        }
        std::vector<std::vector<uint32_t>> correctflags(m,std::vector<uint32_t>(8));
        for (size_t k = 0; k < m; k++) {
          pospopcnt_u8_scalar_naive(vdata[k].data(), vdata[k].size(), correctflags[k].data()); // this is our gold standard
        }
        std::vector<std::vector<uint32_t>> flags(m,std::vector<uint32_t>(8));
        
        const clockdef t1 = std::chrono::high_resolution_clock::now();
        unified.start();
        for (size_t k = 0; k < m ; k++) {
          fn(vdata[k].data(), vdata[k].size(), flags[k].data());
        }
        unified.end(results);
        const clockdef t2 = std::chrono::high_resolution_clock::now();

        uint64_t tot_obs = 0;
        for (size_t km = 0; km < m; ++km)
          for (size_t k = 0; k < 8; ++k) tot_obs += flags[km][k];
        if (tot_obs == 0) { // when a method is not supported it returns all zero
            return false;
        }
        for (size_t km = 0; km < m; ++km) {
          for (size_t k = 0; k < 8; k++) {
            if (correctflags[km][k] != flags[km][k]) {
                if (test) {
                    printf("bug:\n");
                    printf("expected : ");
                    print16(correctflags[km].data());
                    printf("got      : ");
                    print16(flags[km].data());
                    return false;
                } else {
                    isok = false;
                }
            }
          }
        }
        allresults.push_back(results);

        const auto time_span = std::chrono::duration_cast<std::chrono::nanoseconds>(t2 - t1);
        times.push_back(time_span.count());
    }

    uint32_t tot_time = std::accumulate(times.begin(), times.end(), 0);
    double mean_time = tot_time / times.size();

    std::vector<unsigned long long> mins = compute_mins(allresults);
    std::vector<double> avg = compute_averages(allresults);

    double throughput = (n / (1024*1024.0)) / (mean_time / 1000000000.0);
    
    if (tabular) {
        for (int i = 0; i < iterations; ++i) {
            throughput = (n / (1024*1024.0)) / (times[i] / 1000000000.0);
            printf("%s\t%u\t%d\t", fn_name.c_str(), n, i);
            printf("%4.2f\t%4.3f\t%4.3f\t",
                    double(allresults[i][1]) / allresults[i][0], double(allresults[i][0]) / (n*m), double(allresults[i][1]) / (n*m));
            printf("%llu\t%llu\t%llu\t%llu\t%llu\t",
                    allresults[i][0], allresults[i][1], allresults[i][2], allresults[i][3], allresults[i][4]);
            printf("%u\t%4.2f\n", times[i], throughput);
        }
    } else if (verbose) {
        printf("instructions per cycle %4.2f, cycles per 8-bit word:  %4.3f, "
               "instructions per 8-bit word %4.3f \n",
                double(mins[1]) / mins[0], double(mins[0]) / (n*m), double(mins[1]) / (n*m));
        // first we display mins
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu "
               "cache ref., %8llu cache mis.\n",
                mins[0], mins[1], mins[2], mins[3], mins[4]);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f "
               "cache ref., %8.1f cache mis.\n",
                avg[0], avg[1], avg[2], avg[3], avg[4]);
        printf("avg time: %f ns, %4.2f mb/s\n", mean_time, throughput);
    } else {
        printf("cycles per 8-bit word:  %4.3f; ref cycles per 8-bit word: %4.3f \n", double(mins[0]) / (n*m), double(mins[5]) / (n*m));
    }

    return isok;
}